

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O1

AllocationCallbackRecord *
vk::AllocationCallbackRecord::internalFree
          (AllocationCallbackRecord *__return_storage_ptr__,size_t size,
          VkInternalAllocationType type,VkSystemAllocationScope scope)

{
  __return_storage_ptr__->type = TYPE_INTERNAL_FREE;
  (__return_storage_ptr__->data).allocation.size = size;
  (__return_storage_ptr__->data).internalAllocation.type = type;
  (__return_storage_ptr__->data).internalAllocation.scope = scope;
  return __return_storage_ptr__;
}

Assistant:

AllocationCallbackRecord AllocationCallbackRecord::internalFree (size_t size, VkInternalAllocationType type, VkSystemAllocationScope scope)
{
	AllocationCallbackRecord record;

	record.type								= TYPE_INTERNAL_FREE;
	record.data.internalAllocation.size		= size;
	record.data.internalAllocation.type		= type;
	record.data.internalAllocation.scope	= scope;

	return record;
}